

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_sse2.cpp
# Opt level: O2

void memfill32(uint32_t *dest,uint32_t value,int length)

{
  uint32_t *puVar1;
  long lVar2;
  
  puVar1 = dest + 0x10;
  for (; (length != 0 && (((ulong)dest & 0xf) != 0)); dest = dest + 1) {
    puVar1[-0x10] = value;
    puVar1 = puVar1 + 1;
    length = length + -1;
  }
  for (; 0x1f < length; length = length + -0x20) {
    puVar1[-0x10] = value;
    puVar1[-0xf] = value;
    puVar1[-0xe] = value;
    puVar1[-0xd] = value;
    puVar1[-0xc] = value;
    puVar1[-0xb] = value;
    puVar1[-10] = value;
    puVar1[-9] = value;
    puVar1[-8] = value;
    puVar1[-7] = value;
    puVar1[-6] = value;
    puVar1[-5] = value;
    puVar1[-4] = value;
    puVar1[-3] = value;
    puVar1[-2] = value;
    puVar1[-1] = value;
    *puVar1 = value;
    puVar1[1] = value;
    puVar1[2] = value;
    puVar1[3] = value;
    puVar1[4] = value;
    puVar1[5] = value;
    puVar1[6] = value;
    puVar1[7] = value;
    puVar1[8] = value;
    puVar1[9] = value;
    puVar1[10] = value;
    puVar1[0xb] = value;
    puVar1[0xc] = value;
    puVar1[0xd] = value;
    puVar1[0xe] = value;
    puVar1[0xf] = value;
    puVar1 = puVar1 + 0x20;
  }
  if (length < 0x10) {
    puVar1 = puVar1 + -0x10;
  }
  else {
    puVar1[-0x10] = value;
    puVar1[-0xf] = value;
    puVar1[-0xe] = value;
    puVar1[-0xd] = value;
    puVar1[-0xc] = value;
    puVar1[-0xb] = value;
    puVar1[-10] = value;
    puVar1[-9] = value;
    puVar1[-8] = value;
    puVar1[-7] = value;
    puVar1[-6] = value;
    puVar1[-5] = value;
    puVar1[-4] = value;
    puVar1[-3] = value;
    puVar1[-2] = value;
    puVar1[-1] = value;
    length = length + -0x10;
  }
  if (7 < length) {
    *puVar1 = value;
    puVar1[1] = value;
    puVar1[2] = value;
    puVar1[3] = value;
    puVar1[4] = value;
    puVar1[5] = value;
    puVar1[6] = value;
    puVar1[7] = value;
    puVar1 = puVar1 + 8;
    length = length + -8;
  }
  if (3 < length) {
    *puVar1 = value;
    puVar1[1] = value;
    puVar1[2] = value;
    puVar1[3] = value;
    puVar1 = puVar1 + 4;
    length = length + -4;
  }
  for (lVar2 = 0; length != (int)lVar2; lVar2 = lVar2 + 1) {
    puVar1[lVar2] = value;
  }
  return;
}

Assistant:

void memfill32(uint32_t* dest, uint32_t value, int length)
{
    __m128i vector_data = _mm_set_epi32(value, value, value, value);

    // run till memory alligned to 16byte memory
    while (length && ((uintptr_t)dest & 0xf)) {
        *dest++ = value;
        length--;
    }

    while (length >= 32) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);
        _mm_store_si128((__m128i*)(dest + 8), vector_data);
        _mm_store_si128((__m128i*)(dest + 12), vector_data);
        _mm_store_si128((__m128i*)(dest + 16), vector_data);
        _mm_store_si128((__m128i*)(dest + 20), vector_data);
        _mm_store_si128((__m128i*)(dest + 24), vector_data);
        _mm_store_si128((__m128i*)(dest + 28), vector_data);

        dest += 32;
        length -= 32;
    }

    if (length >= 16) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);
        _mm_store_si128((__m128i*)(dest + 8), vector_data);
        _mm_store_si128((__m128i*)(dest + 12), vector_data);

        dest += 16;
        length -= 16;
    }

    if (length >= 8) {
        _mm_store_si128((__m128i*)(dest), vector_data);
        _mm_store_si128((__m128i*)(dest + 4), vector_data);

        dest += 8;
        length -= 8;
    }

    if (length >= 4) {
        _mm_store_si128((__m128i*)(dest), vector_data);

        dest += 4;
        length -= 4;
    }

    while (length) {
        *dest++ = value;
        length--;
    }
}